

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

CoatedConductorMaterial *
pbrt::CoatedConductorMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  CoatedConductorMaterial *pCVar4;
  undefined8 in_RCX;
  FloatTexture *in_RDI;
  bool remapRoughness;
  FloatTexture displacement;
  SpectrumTexture albedo;
  FloatTexture g;
  int nSamples;
  int maxDepth;
  SpectrumTexture reflectance;
  SpectrumTexture k;
  SpectrumTexture conductorEta;
  FloatTexture conductorVRoughness;
  FloatTexture conductorURoughness;
  Spectrum interfaceEta;
  FloatTexture thickness;
  FloatTexture interfaceVRoughness;
  FloatTexture interfaceURoughness;
  string *in_stack_fffffffffffff858;
  string *in_stack_fffffffffffff860;
  TextureParameterDictionary *in_stack_fffffffffffff868;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff878;
  TextureParameterDictionary *in_stack_fffffffffffff880;
  Allocator in_stack_fffffffffffff888;
  allocator<char> *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  Allocator in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8b8;
  TextureParameterDictionary *in_stack_fffffffffffff8c0;
  Allocator in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  string *in_stack_fffffffffffff8d8;
  TextureParameterDictionary *in_stack_fffffffffffff8e0;
  Allocator in_stack_fffffffffffff8e8;
  Spectrum *args_3;
  FloatTexture *args_2;
  FloatTexture *args_1;
  FloatTexture *args;
  polymorphic_allocator<std::byte> *this;
  undefined8 in_stack_fffffffffffff920;
  SpectrumType spectrumType;
  string *in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  Allocator in_stack_fffffffffffff938;
  SpectrumTexture *in_stack_fffffffffffff950;
  FloatTexture *in_stack_fffffffffffff958;
  FloatTexture *in_stack_fffffffffffff960;
  FloatTexture *args_8;
  SpectrumTexture *args_9;
  FloatTexture *args_10;
  FloatTexture *args_11;
  FloatTexture *args_12;
  allocator<char> *args_13;
  FloatTexture *in_stack_fffffffffffff998;
  allocator<char> *in_stack_fffffffffffff9a0;
  allocator<char> local_591;
  string local_590 [39];
  byte local_569;
  undefined8 local_568;
  undefined8 local_559;
  undefined4 local_52c;
  ConstantSpectrum *local_528;
  undefined8 local_518;
  undefined8 local_501;
  TaggedPointer local_4e0 [8];
  undefined8 local_4d8;
  undefined8 local_4c9;
  allocator<char> local_499;
  string local_498 [32];
  int local_478;
  allocator<char> local_471;
  string local_470 [32];
  int local_450;
  undefined8 local_449;
  undefined8 local_411;
  undefined8 local_3e0;
  undefined8 local_3d1;
  TaggedPointer local_3b0 [8];
  undefined8 local_3a8;
  undefined8 local_399;
  TaggedPointer local_378 [8];
  undefined8 local_370;
  allocator<char> local_361;
  string local_360 [32];
  TaggedPointer local_340 [8];
  undefined8 local_338;
  allocator<char> local_329;
  string local_328 [40];
  undefined8 local_300;
  allocator<char> local_2f1;
  string local_2f0 [40];
  undefined8 local_2c8;
  allocator<char> local_2b9;
  string local_2b8 [32];
  TaggedPointer local_298 [8];
  undefined8 local_290;
  allocator<char> local_281;
  string local_280 [32];
  TaggedPointer local_260 [12];
  undefined4 local_254;
  undefined8 local_248;
  allocator<char> local_231;
  string local_230 [47];
  allocator<char> local_201;
  string local_200 [32];
  vector<float,_std::allocator<float>_> local_1e0;
  allocator<char> local_1b9;
  string local_1b8 [56];
  TaggedPointer local_180 [8];
  undefined8 local_178;
  allocator<char> local_169;
  string local_168 [40];
  undefined8 local_140;
  allocator<char> local_131;
  string local_130 [40];
  undefined8 local_108;
  allocator<char> local_f9;
  string local_f8 [40];
  undefined8 local_d0;
  allocator<char> local_c1;
  string local_c0 [32];
  TaggedPointer local_a0 [8];
  undefined8 local_98;
  allocator<char> local_79;
  string local_78 [32];
  TaggedPointer local_58 [24];
  FloatTexture *local_40;
  undefined8 local_38;
  
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffff920 >> 0x20);
  local_40 = in_RDI;
  local_38 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_98 = local_38;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8c8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_d0 = local_38;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8c8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_58);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890
              );
    local_108 = local_38;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               (Float)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff888);
    FloatTexture::operator=
              ((FloatTexture *)in_stack_fffffffffffff860,(FloatTexture *)in_stack_fffffffffffff858);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890
              );
    local_140 = local_38;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               (Float)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff888);
    FloatTexture::operator=
              ((FloatTexture *)in_stack_fffffffffffff860,(FloatTexture *)in_stack_fffffffffffff858);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_178 = local_38;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878,
             (Float)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  Spectrum::Spectrum((Spectrum *)0xb08805);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  TextureParameterDictionary::GetFloatArray(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffff870);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffff870);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890
              );
    Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    local_248 = local_38;
    TextureParameterDictionary::GetOneSpectrum
              ((TextureParameterDictionary *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
               (Spectrum *)in_stack_fffffffffffff890,
               (SpectrumType)((ulong)in_stack_fffffffffffff888.memoryResource >> 0x20),
               in_stack_fffffffffffff8a8);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffff860,(Spectrum *)in_stack_fffffffffffff858)
    ;
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator(&local_231);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890
              );
    TextureParameterDictionary::GetFloatArray(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
    std::vector<float,_std::allocator<float>_>::operator[](&local_1e0,0);
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float&>
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff870,
               (float *)in_stack_fffffffffffff868);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffff860,(ConstantSpectrum *)in_stack_fffffffffffff858);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffff860,(Spectrum *)in_stack_fffffffffffff858)
    ;
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffff870);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_180);
  if (!bVar1) {
    local_254 = 0x3fc00000;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff870,
               (float *)in_stack_fffffffffffff868);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffff860,(ConstantSpectrum *)in_stack_fffffffffffff858);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffff860,(Spectrum *)in_stack_fffffffffffff858)
    ;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_290 = local_38;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8c8);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_2c8 = local_38;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8c8);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_260);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890
              );
    local_300 = local_38;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               (Float)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff888);
    FloatTexture::operator=
              ((FloatTexture *)in_stack_fffffffffffff860,(FloatTexture *)in_stack_fffffffffffff858);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_298);
  if (!bVar1) {
    in_stack_fffffffffffff9a0 = &local_329;
    in_stack_fffffffffffff998 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890
              );
    local_338 = local_38;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffff880,in_stack_fffffffffffff878,
               (Float)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff888);
    FloatTexture::operator=
              ((FloatTexture *)in_stack_fffffffffffff860,(FloatTexture *)in_stack_fffffffffffff858);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator(&local_329);
  }
  args_13 = &local_361;
  args_12 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_370 = local_38;
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)
             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),in_stack_fffffffffffff928
             ,spectrumType,in_stack_fffffffffffff938);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  args_11 = (FloatTexture *)&local_399;
  args_10 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_3a8 = local_38;
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)
             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),in_stack_fffffffffffff928
             ,spectrumType,in_stack_fffffffffffff938);
  std::__cxx11::string::~string((string *)((long)&local_399 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  args_9 = (SpectrumTexture *)&local_3d1;
  args_8 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_3e0 = local_38;
  TextureParameterDictionary::GetSpectrumTextureOrNull
            ((TextureParameterDictionary *)
             CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),in_stack_fffffffffffff928
             ,spectrumType,in_stack_fffffffffffff938);
  std::__cxx11::string::~string((string *)((long)&local_3d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_3b0);
  if ((bVar1) &&
     ((bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_340), bVar1 ||
      (bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_378), bVar1)))) {
    ErrorExit((FileLoc *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_3b0);
  if (!bVar1) {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_340);
    if (!bVar1) {
      in_stack_fffffffffffff960 = (FloatTexture *)&local_411;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                 in_stack_fffffffffffff890);
      GetNamedSpectrum(in_stack_fffffffffffff878);
      in_stack_fffffffffffff958 =
           (FloatTexture *)
           pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpectrumConstantTexture,pbrt::Spectrum>
                     ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff870,
                      (Spectrum *)in_stack_fffffffffffff868);
      SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
                ((SpectrumTexture *)in_stack_fffffffffffff860,
                 (SpectrumConstantTexture *)in_stack_fffffffffffff858);
      SpectrumTexture::operator=
                ((SpectrumTexture *)in_stack_fffffffffffff860,
                 (SpectrumTexture *)in_stack_fffffffffffff858);
      std::__cxx11::string::~string((string *)((long)&local_411 + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
    }
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_378);
    if (!bVar1) {
      in_stack_fffffffffffff950 = (SpectrumTexture *)&local_449;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                 in_stack_fffffffffffff890);
      GetNamedSpectrum(in_stack_fffffffffffff878);
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::SpectrumConstantTexture,pbrt::Spectrum>
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff870,
                 (Spectrum *)in_stack_fffffffffffff868);
      SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
                ((SpectrumTexture *)in_stack_fffffffffffff860,
                 (SpectrumConstantTexture *)in_stack_fffffffffffff858);
      SpectrumTexture::operator=
                ((SpectrumTexture *)in_stack_fffffffffffff860,
                 (SpectrumTexture *)in_stack_fffffffffffff858);
      std::__cxx11::string::~string((string *)((long)&local_449 + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_449);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  iVar3 = TextureParameterDictionary::GetOneInt
                    ((TextureParameterDictionary *)in_stack_fffffffffffff860,
                     in_stack_fffffffffffff858,0);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator(&local_471);
  local_450 = iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  iVar3 = TextureParameterDictionary::GetOneInt
                    ((TextureParameterDictionary *)in_stack_fffffffffffff860,
                     in_stack_fffffffffffff858,0);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator(&local_499);
  this = (polymorphic_allocator<std::byte> *)&local_4c9;
  args = local_40;
  local_478 = iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_4d8 = local_38;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878,
             (Float)((ulong)in_stack_fffffffffffff870 >> 0x20),in_stack_fffffffffffff888);
  std::__cxx11::string::~string((string *)((long)&local_4c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  args_1 = (FloatTexture *)&local_501;
  args_2 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  local_518 = local_38;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
             (Spectrum *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
             (SpectrumType)((ulong)in_stack_fffffffffffff8c8.memoryResource >> 0x20),
             in_stack_fffffffffffff8e8);
  std::__cxx11::string::~string((string *)((long)&local_501 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_4e0);
  if (!bVar1) {
    local_52c = 0;
    local_528 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::ConstantSpectrum,float>
                          ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff870,
                           (float *)in_stack_fffffffffffff868);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff870,
               (ConstantSpectrum **)in_stack_fffffffffffff868);
    SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTexture *)in_stack_fffffffffffff860,
               (SpectrumConstantTexture *)in_stack_fffffffffffff858);
    SpectrumTexture::operator=
              ((SpectrumTexture *)in_stack_fffffffffffff860,
               (SpectrumTexture *)in_stack_fffffffffffff858);
  }
  args_3 = (Spectrum *)&local_559;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  local_568 = local_38;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8c8);
  std::__cxx11::string::~string((string *)((long)&local_559 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,in_stack_fffffffffffff890);
  bVar2 = TextureParameterDictionary::GetOneBool
                    ((TextureParameterDictionary *)in_stack_fffffffffffff860,
                     in_stack_fffffffffffff858,false);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  local_569 = bVar2 & 1;
  pCVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CoatedConductorMaterial,pbrt::FloatTexture&,pbrt::FloatTexture&,pbrt::FloatTexture&,pbrt::Spectrum&,pbrt::FloatTexture&,pbrt::SpectrumTexture&,pbrt::FloatTexture&,pbrt::FloatTexture&,pbrt::SpectrumTexture&,pbrt::SpectrumTexture&,pbrt::SpectrumTexture&,pbrt::FloatTexture&,pbrt::Image*&,bool&,int&,int&>
                     (this,args,args_1,args_2,args_3,local_40,in_stack_fffffffffffff950,
                      in_stack_fffffffffffff958,in_stack_fffffffffffff960,(SpectrumTexture *)args_8,
                      args_9,(SpectrumTexture *)args_10,args_11,(Image **)args_12,(bool *)args_13,
                      (int *)in_stack_fffffffffffff998,(int *)in_stack_fffffffffffff9a0);
  return pCVar4;
}

Assistant:

CoatedConductorMaterial *CoatedConductorMaterial::Create(
    const TextureParameterDictionary &parameters, Image *normalMap, const FileLoc *loc,
    Allocator alloc) {
    // interface
    FloatTexture interfaceURoughness =
        parameters.GetFloatTextureOrNull("interface.uroughness", alloc);
    FloatTexture interfaceVRoughness =
        parameters.GetFloatTextureOrNull("interface.vroughness", alloc);
    if (!interfaceURoughness)
        interfaceURoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);
    if (!interfaceVRoughness)
        interfaceVRoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);

    FloatTexture thickness = parameters.GetFloatTexture("thickness", .01, alloc);

    Spectrum interfaceEta;
    if (!parameters.GetFloatArray("interface.eta").empty())
        interfaceEta = alloc.new_object<ConstantSpectrum>(
            parameters.GetFloatArray("interface.eta")[0]);
    else
        interfaceEta = parameters.GetOneSpectrum("interface.eta", nullptr,
                                                 SpectrumType::Unbounded, alloc);
    if (!interfaceEta)
        interfaceEta = alloc.new_object<ConstantSpectrum>(1.5f);

    // conductor
    FloatTexture conductorURoughness =
        parameters.GetFloatTextureOrNull("conductor.uroughness", alloc);
    FloatTexture conductorVRoughness =
        parameters.GetFloatTextureOrNull("conductor.vroughness", alloc);
    if (!conductorURoughness)
        conductorURoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    if (!conductorVRoughness)
        conductorVRoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    SpectrumTexture conductorEta = parameters.GetSpectrumTextureOrNull(
        "conductor.eta", SpectrumType::Unbounded, alloc);
    SpectrumTexture k = parameters.GetSpectrumTextureOrNull(
        "conductor.k", SpectrumType::Unbounded, alloc);
    SpectrumTexture reflectance =
        parameters.GetSpectrumTextureOrNull("reflectance", SpectrumType::Albedo, alloc);

    if (reflectance && (conductorEta || k))
        ErrorExit(loc, "For the coated conductor material, both \"reflectance\" "
                       "and \"eta\" and \"k\" can't be provided.");
    if (!reflectance) {
        if (!conductorEta)
            conductorEta = alloc.new_object<SpectrumConstantTexture>(
                GetNamedSpectrum("metal-Cu-eta"));
        if (!k)
            k = alloc.new_object<SpectrumConstantTexture>(GetNamedSpectrum("metal-Cu-k"));
    }

    int maxDepth = parameters.GetOneInt("maxdepth", 10);
    int nSamples = parameters.GetOneInt("nsamples", 1);

    FloatTexture g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTexture albedo =
        parameters.GetSpectrumTexture("albedo", nullptr, SpectrumType::Albedo, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTexture displacement = parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    return alloc.new_object<CoatedConductorMaterial>(
        interfaceURoughness, interfaceVRoughness, thickness, interfaceEta, g, albedo,
        conductorURoughness, conductorVRoughness, conductorEta, k, reflectance,
        displacement, normalMap, remapRoughness, maxDepth, nSamples);
}